

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjTable::reset_to_image(CVmObjTable *this)

{
  CVmObjGlobPage *this_00;
  vm_image_ptr_page *pvVar1;
  vm_image_ptr_page *pvVar2;
  long lVar3;
  CVmObjPageEntry **ppCVar4;
  uint uVar5;
  size_t *psVar6;
  CVmObjPageEntry *pCVar7;
  size_t sVar8;
  
  CVmUndo::drop_undo(G_undo_X);
  this_00 = this->globals_;
  if (this_00 != (CVmObjGlobPage *)0x0) {
    CVmObjGlobPage::~CVmObjGlobPage(this_00);
    operator_delete(this_00,0x88);
    this->globals_ = (CVmObjGlobPage *)0x0;
  }
  sVar8 = this->pages_used_;
  if (sVar8 != 0) {
    ppCVar4 = this->pages_;
    uVar5 = 0;
    do {
      pCVar7 = *ppCVar4;
      lVar3 = 0;
      do {
        if ((*(ushort *)&pCVar7->field_0x14 & 0x83) == 2) {
          (**(code **)(*(long *)&pCVar7->ptr_ + 0xd8))(pCVar7,(ulong)uVar5 + lVar3);
        }
        pCVar7 = pCVar7 + 1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x1000);
      ppCVar4 = ppCVar4 + 1;
      uVar5 = uVar5 + 0x1000;
      sVar8 = sVar8 - 1;
    } while (sVar8 != 0);
  }
  for (pvVar1 = this->image_ptr_head_; pvVar1 != (vm_image_ptr_page *)0x0; pvVar1 = pvVar1->next_) {
    sVar8 = 400;
    pvVar2 = pvVar1;
    if (pvVar1->next_ == (vm_image_ptr_page *)0x0) {
      sVar8 = this->image_ptr_last_cnt_;
    }
    for (; sVar8 != 0; sVar8 = sVar8 - 1) {
      psVar6 = &pvVar2->ptrs_[0].image_data_len_;
      uVar5 = pvVar2->ptrs_[0].obj_id_;
      if ((this->pages_[uVar5 >> 0xc][uVar5 & 0xfff].field_0x14 & 0x80) == 0) {
        (**(code **)(*(long *)&G_obj_table_X.pages_[uVar5 >> 0xc][uVar5 & 0xfff].ptr_ + 0xd0))
                  (G_obj_table_X.pages_[uVar5 >> 0xc] + (uVar5 & 0xfff),uVar5,
                   pvVar2->ptrs_[0].image_data_ptr_,*psVar6);
      }
      pvVar2 = (vm_image_ptr_page *)psVar6;
    }
  }
  return;
}

Assistant:

void CVmObjTable::reset_to_image(VMG0_)
{
    CVmObjPageEntry **pg;
    CVmObjPageEntry *entry;
    size_t i;
    size_t j;
    vm_obj_id_t id;
    vm_image_ptr_page *ip_page;

    /* 
     *   Drop all undo information.  Since we're resetting to the initial
     *   state, the undo for our outgoing state will no longer be
     *   relevant. 
     */
    G_undo->drop_undo(vmg0_);

    /* delete all of the globals */
    if (globals_ != 0)
    {
        delete globals_;
        globals_ = 0;
    }

    /* 
     *   Go through the object table and reset each non-transient object in
     *   the root set to its initial conditions.  
     */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* scan all objects on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; --j, ++entry, ++id)
        {
            /* 
             *   if it's not free, and it's in the root set, and it's not
             *   transient, reset it 
             */
            if (!entry->free_ && entry->in_root_set_ && !entry->transient_)
            {
                /*
                 *   This object is part of the root set, so it's part of
                 *   the state immediately after loading the image.  Reset
                 *   the object to its load file conditions.  
                 */
                entry->get_vm_obj()->reset_to_image(vmg_ id);
            }
        }
    }

    /*
     *   Go through all of the objects for which we've explicitly saved the
     *   original image file location, and ask them to reset using the image
     *   data. 
     */
    for (ip_page = image_ptr_head_ ; ip_page != 0 ; ip_page = ip_page->next_)
    {
        size_t cnt;
        vm_image_ptr *slot;
        
        /* 
         *   get the count for this page - if this is the last page, it's
         *   the last page counter; otherwise, it's a full page, since we
         *   fill up each page before creating a new one 
         */
        if (ip_page->next_ == 0)
            cnt = image_ptr_last_cnt_;
        else
            cnt = VM_IMAGE_PTRS_PER_PAGE;

        /* go through the records on the page */
        for (slot = ip_page->ptrs_ ; cnt != 0 ; --cnt, ++slot)
        {
            /* it this object is non-transient, reload it */
            if (!get_entry(slot->obj_id_)->transient_)
            {
                /* reload it using the saved image data */
                vm_objp(vmg_ slot->obj_id_)
                    ->reload_from_image(vmg_ slot->obj_id_,
                                        slot->image_data_ptr_,
                                        slot->image_data_len_);
            }
        }
    }
}